

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<long_double,_10>::Resize
          (TPZManVector<long_double,_10> *this,int64_t newsize,longdouble *object)

{
  longdouble lVar1;
  longdouble *plVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  longdouble *plVar7;
  long lVar8;
  double dVar9;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar3 = (this->super_TPZVec<long_double>).fNElements;
  if (newsize != lVar3) {
    lVar8 = (this->super_TPZVec<long_double>).fNAlloc;
    if (lVar8 < newsize) {
      if (newsize < 0xb) {
        if (lVar3 < 1) {
          lVar3 = 0;
        }
        else {
          plVar2 = (this->super_TPZVec<long_double>).fStore;
          lVar4 = 0;
          lVar8 = lVar3;
          do {
            *(unkbyte10 *)((long)this->fExtAlloc + lVar4) = *(unkbyte10 *)((long)plVar2 + lVar4);
            lVar4 = lVar4 + 0x10;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        lVar8 = newsize - lVar3;
        if (lVar8 != 0 && lVar3 <= newsize) {
          plVar2 = this->fExtAlloc + lVar3;
          do {
            *plVar2 = *object;
            plVar2 = plVar2 + 1;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        plVar2 = (this->super_TPZVec<long_double>).fStore;
        if (plVar2 != (longdouble *)0x0 && plVar2 != this->fExtAlloc) {
          operator_delete__(plVar2);
        }
        (this->super_TPZVec<long_double>).fStore = this->fExtAlloc;
        (this->super_TPZVec<long_double>).fNElements = newsize;
        (this->super_TPZVec<long_double>).fNAlloc = 10;
      }
      else {
        dVar9 = (double)lVar8 * 1.2;
        uVar5 = (long)dVar9;
        if (dVar9 < (double)newsize) {
          uVar5 = newsize;
        }
        plVar2 = (longdouble *)operator_new__(-(ulong)(uVar5 >> 0x3c != 0) | uVar5 << 4);
        lVar8 = 0;
        if (0 < lVar3) {
          plVar7 = (this->super_TPZVec<long_double>).fStore;
          lVar6 = 0;
          lVar4 = lVar3;
          do {
            *(unkbyte10 *)((long)plVar2 + lVar6) = *(unkbyte10 *)((long)plVar7 + lVar6);
            lVar6 = lVar6 + 0x10;
            lVar4 = lVar4 + -1;
            lVar8 = lVar3;
          } while (lVar4 != 0);
        }
        lVar3 = newsize - lVar8;
        if (lVar3 != 0 && lVar8 <= newsize) {
          lVar1 = *object;
          plVar7 = plVar2 + lVar8;
          do {
            *plVar7 = lVar1;
            plVar7 = plVar7 + 1;
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
        }
        plVar7 = (this->super_TPZVec<long_double>).fStore;
        if (plVar7 != (longdouble *)0x0 && plVar7 != this->fExtAlloc) {
          operator_delete__(plVar7);
        }
        (this->super_TPZVec<long_double>).fStore = plVar2;
        (this->super_TPZVec<long_double>).fNElements = newsize;
        (this->super_TPZVec<long_double>).fNAlloc = uVar5;
      }
    }
    else {
      lVar8 = newsize - lVar3;
      if (lVar8 != 0 && lVar3 <= newsize) {
        plVar2 = (this->super_TPZVec<long_double>).fStore + lVar3;
        do {
          *plVar2 = *object;
          plVar2 = plVar2 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      (this->super_TPZVec<long_double>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}